

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

int QTestResult::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *__format;
  long in_FS_OFFSET;
  char msg [4096];
  int in_stack_ffffffffffffefac;
  char *in_stack_ffffffffffffefb0;
  char *in_stack_ffffffffffffefb8;
  undefined1 statement;
  undefined8 in_stack_ffffffffffffefc0;
  undefined3 in_stack_ffffffffffffeff4;
  uint line;
  char cVar4;
  undefined7 in_stack_ffffffffffffeff9;
  char *in_stack_fffffffffffff048;
  
  statement = (undefined1)((ulong)in_stack_ffffffffffffefc0 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  line = CONCAT13((char)ctx,in_stack_ffffffffffffeff4) & 0x1ffffff;
  if (sig == (uchar *)0x0) {
    qt_assert("statementStr",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x12f);
  }
  cVar4 = '\0';
  iVar3 = QTestLog::verboseLevel();
  if (1 < iVar3) {
    snprintf(&stack0xffffffffffffeff8,0x1000,"QVERIFY(%s)",sig);
    QTestLog::info(in_stack_fffffffffffff048,(char *)CONCAT71(in_stack_ffffffffffffeff9,cVar4),line)
    ;
  }
  if ((bool)((byte)(line >> 0x18) & 1) == (QTest::expectFailMode != 0)) {
    in_stack_ffffffffffffefb8 = &stack0xffffffffffffeff8;
    __format = "\'%s\' returned FALSE. (%s)";
    if ((line & 0x1000000) != 0) {
      __format = "\'%s\' returned TRUE unexpectedly. (%s)";
    }
    in_stack_ffffffffffffefb0 = (char *)siglen;
    if (siglen == 0) {
      in_stack_ffffffffffffefb0 = "";
    }
    snprintf(in_stack_ffffffffffffefb8,0x1000,__format,sig,in_stack_ffffffffffffefb0);
    statement = (undefined1)((ulong)__format >> 0x30);
  }
  bVar2 = checkStatement((bool)statement,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
                         in_stack_ffffffffffffefac);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),bVar2);
}

Assistant:

bool QTestResult::verify(bool statement, const char *statementStr,
                         const char *description, const char *file, int line)
{
    QTEST_ASSERT(statementStr);

    Q_DECL_UNINITIALIZED char msg[maxMsgLen];
    msg[0] = '\0';

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "QVERIFY(%s)", statementStr);
        QTestLog::info(msg, file, line);
    }

    if (statement == !!QTest::expectFailMode) {
        std::snprintf(msg, maxMsgLen,
                      statement ? "'%s' returned TRUE unexpectedly. (%s)" : "'%s' returned FALSE. (%s)",
                      statementStr, description ? description : "");
    }

    return checkStatement(statement, msg, file, line);
}